

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hash.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  code *pcVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  time_t tVar10;
  sx_alloc *alloc;
  sx_hashtbl *tbl;
  void *pvVar11;
  uint64_t uVar12;
  long *plVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  sx__hashtbl2 *_tbl;
  long lVar22;
  void *pvVar23;
  int i;
  int iVar24;
  long lVar25;
  char *pcVar26;
  bool bVar27;
  sx_rng rng;
  sx_rng local_48;
  uint64_t local_38;
  
  tVar10 = time((time_t *)0x0);
  sx_rng_seed(&local_48,(uint32_t)tVar10);
  sx_tm_init();
  alloc = sx_alloc_malloc();
  tbl = sx_hashtbl_create(alloc,10000);
  if (tbl == (sx_hashtbl *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x79,"tbl");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  pvVar11 = (*alloc->alloc_cb)((void *)0x0,320000,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (pvVar11 == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x7d,"items");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  puts("Generating random strings ...");
  lVar25 = 0;
  pvVar23 = pvVar11;
  do {
    uVar6 = sx_rng_gen(&local_48);
    lVar22 = 0;
    do {
      uVar7 = sx_rng_gen(&local_48);
      *(char *)((long)pvVar23 + lVar22) = (char)uVar7 + (char)(uVar7 / 0x4b) * -0x4b + '0';
      lVar22 = lVar22 + 1;
    } while ((ulong)(uVar6 & 0xf) + 0x10 != lVar22);
    *(undefined1 *)((long)pvVar11 + (ulong)(uVar6 & 0xf) + lVar25 * 0x20 + 0x10) = 0;
    lVar25 = lVar25 + 1;
    pvVar23 = (void *)((long)pvVar23 + 0x20);
  } while (lVar25 != 10000);
  puts("sx_hashtbl:");
  puts("\tPushing into hash table ...");
  uVar12 = sx_tm_now();
  pcVar26 = (char *)((long)pvVar11 + 1);
  lVar25 = 0;
  do {
    uVar20 = 0x811c9dc5;
    cVar16 = *(char *)((long)pvVar11 + lVar25 * 0x20);
    pcVar21 = pcVar26;
    while (cVar16 != '\0') {
      uVar20 = ((int)cVar16 ^ uVar20) * 0x1000193;
      cVar16 = *pcVar21;
      pcVar21 = pcVar21 + 1;
    }
    sx_hashtbl_add(tbl,uVar20,(int)lVar25);
    lVar25 = lVar25 + 1;
    pcVar26 = pcVar26 + 0x20;
  } while (lVar25 != 10000);
  uVar12 = sx_tm_since(uVar12);
  dVar3 = sx_tm_ms(uVar12);
  dVar4 = sx_tm_sec(uVar12);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
  puts("\tSearching for random items ...");
  uVar12 = sx_tm_now();
  pcVar26 = (char *)((long)pvVar11 + 1);
  iVar5 = 0;
  do {
    uVar6 = sx_rng_gen(&local_48);
    uVar20 = uVar6 % 10000;
    cVar16 = *(char *)((long)pvVar11 + (ulong)(uVar20 << 5));
    if (cVar16 == '\0') {
      uVar6 = 0x811c9dc5;
    }
    else {
      pcVar21 = pcVar26 + (ulong)uVar6 * 0x20 + ((ulong)uVar6 / 10000) * -320000;
      uVar6 = 0x811c9dc5;
      do {
        uVar6 = ((int)cVar16 ^ uVar6) * 0x1000193;
        cVar16 = *pcVar21;
        pcVar21 = pcVar21 + 1;
      } while (cVar16 != '\0');
    }
    iVar8 = sx_hashtbl_find(tbl,uVar6);
    if (iVar8 == -1) {
      uVar9 = 0xffffffff;
    }
    else {
      uVar9 = tbl->values[iVar8];
    }
    lVar25 = (ulong)(uVar20 << 5) + (long)pvVar11;
    if (uVar9 == 0xffffffff || uVar9 == uVar20) {
      if (uVar9 == 0xffffffff) {
        printf("\tERROR: Item not found: %s (index: %d)\n",lVar25,(ulong)uVar20);
      }
    }
    else {
      printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
             ,lVar25,(ulong)uVar20,(void *)((long)(int)uVar9 * 0x20 + (long)pvVar11));
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 10000);
  uVar12 = sx_tm_since(uVar12);
  dVar3 = sx_tm_ms(uVar12);
  dVar4 = sx_tm_sec(uVar12);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
  printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)(uint)tbl->_miss_cnt,
         (ulong)(uint)tbl->_probe_cnt);
  plVar13 = (long *)(*alloc->alloc_cb)((void *)0x0,0x19670,0,(char *)0x0,(char *)0x0,0,
                                       alloc->user_data);
  if (plVar13 == (long *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c",
               0x21);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x21,"Out of memory");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  pvVar23 = (void *)((long)plVar13 + 0x27U & 0xfffffffffffffff8);
  *plVar13 = (long)pvVar23;
  plVar13[1] = (long)pvVar23 + 0xcb24;
  plVar13[2] = 0x32c900000000;
  plVar13[3] = 0;
  memset(pvVar23,0,0xcb24);
  if (plVar13 == (long *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0xb0,"tbl2");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  puts("sx_hashtbl2:");
  puts("\tPushing into hash table ...");
  uVar12 = sx_tm_now();
  lVar25 = 0;
  do {
    uVar20 = 0x811c9dc5;
    cVar16 = *(char *)((long)pvVar11 + lVar25 * 0x20);
    pcVar21 = pcVar26;
    while (cVar16 != '\0') {
      uVar20 = ((int)cVar16 ^ uVar20) * 0x1000193;
      cVar16 = *pcVar21;
      pcVar21 = pcVar21 + 1;
    }
    if (*(int *)((long)plVar13 + 0x14) <= (int)plVar13[2]) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                        ,0x3d,"tbl->count < tbl->capacity");
      pcVar2 = (code *)swi(3);
      iVar5 = (*pcVar2)();
      return iVar5;
    }
    uVar9 = uVar20;
    do {
      uVar14 = (ulong)uVar9 % (ulong)*(uint *)((long)plVar13 + 0x14);
      uVar9 = (int)uVar14 + 1;
    } while (*(int *)(*plVar13 + uVar14 * 4) != 0);
    *(uint *)(*plVar13 + uVar14 * 4) = uVar20;
    *(int *)(plVar13[1] + uVar14 * 4) = (int)lVar25;
    *(int *)(plVar13 + 2) = (int)plVar13[2] + 1;
    lVar25 = lVar25 + 1;
    pcVar26 = pcVar26 + 0x20;
  } while (lVar25 != 10000);
  uVar12 = sx_tm_since(uVar12);
  dVar3 = sx_tm_ms(uVar12);
  dVar4 = sx_tm_sec(uVar12);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
  puts("\tSearching for random items ...");
  local_38 = sx_tm_now();
  iVar5 = 0;
  do {
    uVar6 = sx_rng_gen(&local_48);
    uVar20 = uVar6 % 10000;
    cVar16 = *(char *)((long)pvVar11 + (ulong)(uVar20 << 5));
    if (cVar16 == '\0') {
      uVar9 = 0x811c9dc5;
    }
    else {
      pcVar26 = (char *)((long)pvVar11 + (ulong)uVar6 * 0x20 + ((ulong)uVar6 / 10000) * -320000 + 1)
      ;
      uVar9 = 0x811c9dc5;
      do {
        uVar9 = ((int)cVar16 ^ uVar9) * 0x1000193;
        cVar16 = *pcVar26;
        pcVar26 = pcVar26 + 1;
      } while (cVar16 != '\0');
    }
    uVar1 = *(uint *)((long)plVar13 + 0x14);
    uVar14 = (ulong)uVar9 % (ulong)uVar1;
    iVar17 = (int)uVar14;
    iVar8 = iVar17;
    if (*(uint *)(*plVar13 + uVar14 * 4) != uVar9) {
      *(int *)(plVar13 + 3) = (int)plVar13[3] + 1;
      iVar8 = -1;
      if (1 < uVar1) {
        iVar24 = *(int *)((long)plVar13 + 0x1c);
        iVar19 = uVar1 - 1;
        iVar18 = 1;
        uVar14 = (ulong)uVar9 / (ulong)uVar1;
        do {
          iVar24 = iVar24 + 1;
          uVar15 = (ulong)(uint)(iVar18 + iVar17) % (ulong)uVar1;
          *(int *)((long)plVar13 + 0x1c) = iVar24;
          bVar27 = *(uint *)(*plVar13 + (long)(int)uVar15 * 4) == uVar9;
          if (!bVar27) {
            uVar15 = uVar14;
          }
          iVar8 = (int)uVar15;
          if (bVar27) break;
          iVar18 = iVar18 + 1;
          iVar19 = iVar19 + -1;
          uVar14 = uVar15;
          iVar8 = -1;
        } while (iVar19 != 0);
      }
    }
    if (iVar8 == -1) {
      uVar9 = 0xffffffff;
    }
    else {
      uVar9 = *(uint *)(plVar13[1] + (long)iVar8 * 4);
    }
    lVar25 = (ulong)(uVar20 << 5) + (long)pvVar11;
    if (uVar9 == 0xffffffff || uVar9 == uVar20) {
      if (uVar9 == 0xffffffff) {
        printf("\tERROR: Item not found: %s (index: %d)\n",lVar25,(ulong)uVar20);
      }
    }
    else {
      printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
             ,lVar25,(ulong)uVar20,(void *)((long)(int)uVar9 * 0x20 + (long)pvVar11));
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 10000) {
      uVar12 = sx_tm_since(local_38);
      dVar3 = sx_tm_ms(uVar12);
      dVar4 = sx_tm_sec(uVar12);
      printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
      printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)*(uint *)(plVar13 + 3),
             (ulong)*(uint *)((long)plVar13 + 0x1c));
      sx_hashtbl_destroy(tbl,alloc);
      if (plVar13 == (long *)0x0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                          ,0x36,"tbl");
        pcVar2 = (code *)swi(3);
        iVar5 = (*pcVar2)();
        return iVar5;
      }
      plVar13[2] = 0;
      (*alloc->alloc_cb)(plVar13,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
      sx_os_getch();
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));
    sx_tm_init();

    const int num_samples = 10000;
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_hashtbl* tbl = sx_hashtbl_create(alloc, num_samples);
    sx_assert(tbl);

    // Make random string array
    str_item* items = (str_item*)sx_malloc(alloc, sizeof(str_item) * num_samples);
    sx_assert(items);

    puts("Generating random strings ...");
    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        int num_chars = sx_rng_gen_rangei(&rng, 16, sizeof(item->str) - 1);
        for (int ii = 0; ii < num_chars; ii++) {
            char ch = (char)sx_rng_gen_rangei(&rng, 48, 122);
            sx_assert(ch >= 48 && ch <= 122);
            item->str[ii] = ch;
        }
        item->str[num_chars] = 0;
    }

    uint64_t start_tm, delta_tm;
    puts("sx_hashtbl:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx_hashtbl_add(tbl, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx_hashtbl_find_get(tbl, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl->_miss_cnt,
               tbl->_probe_cnt);

    ////////////////////////////////////////////////////////////////////////////////////////////////
    // sx__hashtbl2
    sx__hashtbl2* tbl2 = sx__hashtbl2_create(alloc, num_samples);
    sx_assert(tbl2);

    puts("sx_hashtbl2:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx__hashtbl2_add(tbl2, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx__hashtbl2_find_get(tbl2, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl2->_miss_cnt,
               tbl2->_probe_cnt);

    sx_hashtbl_destroy(tbl, alloc);
    sx__hashtbl2_destroy(tbl2, alloc);

    sx_os_getch();
    return 0;
}